

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fragment.cpp
# Opt level: O0

error_code __thiscall
pstore::exchange::import_ns::address_patch::operator()
          (address_patch *this,transaction_base *transaction)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  database *pdVar4;
  element_type *this_00;
  type *this_01;
  iterator pvVar5;
  element_type *peVar6;
  value_pointer_type ppVar7;
  element_type *this_02;
  typed_address<pstore::repo::definition> tVar8;
  error_code eVar9;
  undefined1 local_360 [8];
  shared_ptr<const_pstore::repo::compilation> compilation;
  iterator local_348;
  iterator_base<true> local_258;
  undefined1 local_168 [8];
  const_iterator pos;
  value_type *l;
  iterator __end2;
  iterator __begin2;
  type *__range2;
  undefined1 local_48 [8];
  shared_ptr<pstore::repo::fragment> fragment;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  compilations;
  transaction_base *transaction_local;
  address_patch *this_local;
  error_category *local_10;
  
  pdVar4 = gsl::not_null::operator_cast_to_database_((not_null *)&this->db_);
  pstore::index::
  get_index<(pstore::trailer::indices)0,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
            ((index *)&fragment.
                       super___shared_ptr<pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,pdVar4,true);
  repo::fragment::load((fragment *)local_48,transaction,&this->fragment_extent_);
  this_00 = std::
            __shared_ptr_access<pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_48);
  this_01 = repo::fragment::at<(pstore::repo::section_kind)18>(this_00);
  __end2 = repo::linked_definitions::begin(this_01);
  pvVar5 = repo::linked_definitions::end(this_01);
  for (; __end2 != pvVar5; __end2 = __end2 + 1) {
    pos.pos_._M_t.
    super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
    .
    super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>,_true,_true>
          )(__uniq_ptr_data<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>,_true,_true>
            )__end2;
    peVar6 = std::
             __shared_ptr_access<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&fragment.
                              super___shared_ptr<pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
    pdVar4 = gsl::not_null::operator_cast_to_database_((not_null *)&this->db_);
    pstore::index::
    hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
    ::find<pstore::uint128,void>
              ((const_iterator *)local_168,
               (hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
                *)peVar6,pdVar4,
               (uint128 *)
               pos.pos_._M_t.
               super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
               .
               super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
               ._M_head_impl);
    peVar6 = std::
             __shared_ptr_access<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&fragment.
                              super___shared_ptr<pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
    pdVar4 = gsl::not_null::operator_cast_to_database_((not_null *)&this->db_);
    pstore::index::
    hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
    ::end(&local_348,peVar6,pdVar4);
    pstore::index::
    hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
    ::iterator_base<true>::iterator_base<true,void>((iterator_base<true> *)&local_258,&local_348);
    bVar2 = pstore::index::
            hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
            ::iterator_base<true>::operator==((iterator_base<true> *)local_168,&local_258);
    pstore::index::
    hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
    ::iterator_base<true>::~iterator_base(&local_258);
    pstore::index::
    hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
    ::iterator_base<false>::~iterator_base(&local_348);
    if (bVar2) {
      std::error_code::error_code<pstore::exchange::import_ns::error,void>
                ((error_code *)&this_local,no_such_compilation);
      compilation.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ = 1;
    }
    else {
      pdVar4 = transaction_base::db(transaction);
      ppVar7 = pstore::index::
               hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
               ::iterator_base<true>::operator->((iterator_base<true> *)local_168);
      repo::compilation::load((compilation *)local_360,pdVar4,&ppVar7->second);
      uVar1 = *(uint *)((long)pos.pos_._M_t.
                              super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
                              .
                              super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
                              ._M_head_impl + 0x10);
      this_02 = std::
                __shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_360);
      sVar3 = repo::compilation::size(this_02);
      bVar2 = uVar1 < sVar3;
      if (bVar2) {
        ppVar7 = pstore::index::
                 hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                 ::iterator_base<true>::operator->((iterator_base<true> *)local_168);
        tVar8 = repo::compilation::index_address
                          ((typed_address<pstore::repo::compilation>)(ppVar7->second).addr.a_.a_,
                           *(size_type *)
                            ((long)pos.pos_._M_t.
                                   super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
                                   ._M_head_impl + 0x10));
        ((address *)
        ((long)pos.pos_._M_t.
               super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
               .
               super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
               ._M_head_impl + 0x18))->a_ = (value_type)tVar8.a_.a_;
      }
      else {
        std::error_code::error_code<pstore::exchange::import_ns::error,void>
                  ((error_code *)&this_local,index_out_of_range);
      }
      compilation.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._5_3_ = 0;
      compilation.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_1_ = !bVar2;
      std::shared_ptr<const_pstore::repo::compilation>::~shared_ptr
                ((shared_ptr<const_pstore::repo::compilation> *)local_360);
    }
    pstore::index::
    hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
    ::iterator_base<true>::~iterator_base((iterator_base<true> *)local_168);
    if (compilation.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ != 0) goto LAB_00294503;
  }
  std::error_code::error_code((error_code *)&this_local);
  compilation.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = 1;
LAB_00294503:
  std::shared_ptr<pstore::repo::fragment>::~shared_ptr
            ((shared_ptr<pstore::repo::fragment> *)local_48);
  std::
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  ::~shared_ptr((shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                 *)&fragment.super___shared_ptr<pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  eVar9._4_4_ = 0;
  eVar9._M_value = (uint)this_local;
  eVar9._M_cat = local_10;
  return eVar9;
}

Assistant:

std::error_code address_patch::operator() (transaction_base * const transaction) {
                auto const compilations = index::get_index<trailer::indices::compilation> (*db_);

                auto const fragment = repo::fragment::load (*transaction, fragment_extent_);
                for (repo::linked_definitions::value_type & l :
                     fragment->template at<repo::section_kind::linked_definitions> ()) {
                    auto const pos = compilations->find (*db_, l.compilation);
                    if (pos == compilations->end (*db_)) {
                        return error::no_such_compilation;
                    }
                    auto const compilation =
                        repo::compilation::load (transaction->db (), pos->second);
                    static_assert (std::is_unsigned<decltype (l.index)>::value,
                                   "index is not unsigned so we'll have to check for negative");
                    if (l.index >= compilation->size ()) {
                        return error::index_out_of_range;
                    }

                    l.pointer = repo::compilation::index_address (pos->second.addr, l.index);
                }
                return {};
            }